

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

FrameDisplay * __thiscall
Js::StackScriptFunction::BoxState::BoxFrameDisplay(BoxState *this,FrameDisplay *frameDisplay)

{
  code *pcVar1;
  Type *slotArray;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  BoxState *this_00;
  size_t sVar5;
  ScopeSlots local_90;
  Type *local_88;
  Type *pScope;
  BoxState *pBStack_78;
  uint16 i;
  FrameDisplay *local_70;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  uint16 local_2a;
  BoxState *pBStack_28;
  uint16 length;
  FrameDisplay *boxedFrameDisplay;
  FrameDisplay *frameDisplay_local;
  BoxState *this_local;
  
  boxedFrameDisplay = frameDisplay;
  frameDisplay_local = (FrameDisplay *)this;
  if (frameDisplay == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x264,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (boxedFrameDisplay == (FrameDisplay *)&NullFrameDisplay) {
    this_local = (BoxState *)boxedFrameDisplay;
  }
  else {
    pBStack_28 = (BoxState *)0x0;
    bVar2 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<Js::FrameDisplay*>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,&boxedFrameDisplay,&stack0xffffffffffffffd8);
    if (bVar2) {
      this_local = pBStack_28;
    }
    else {
      local_2a = FrameDisplay::GetLength(boxedFrameDisplay);
      bVar2 = ThreadContext::IsOnStack(boxedFrameDisplay);
      if (bVar2) {
        pRVar4 = ScriptContext::GetRecycler(this->scriptContext);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_58,(type_info *)&FrameDisplay::typeinfo,(ulong)local_2a << 3,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                   ,0x278);
        pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_58);
        local_68 = Memory::Recycler::Alloc;
        local_60 = 0;
        this_00 = (BoxState *)new<Memory::Recycler>(8,pRVar4,0x446fd0,0);
        FrameDisplay::FrameDisplay((FrameDisplay *)this_00,local_2a,false);
        pBStack_28 = this_00;
      }
      else {
        pBStack_28 = (BoxState *)boxedFrameDisplay;
      }
      local_70 = boxedFrameDisplay;
      pBStack_78 = pBStack_28;
      JsUtil::
      BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(&this->boxedValues,&local_70,&stack0xffffffffffffff88);
      for (pScope._6_2_ = 0; pScope._6_2_ < local_2a; pScope._6_2_ = pScope._6_2_ + 1) {
        local_88 = (Type *)FrameDisplay::GetItem(boxedFrameDisplay,(uint)pScope._6_2_);
        bVar2 = ScopeSlots::Is(local_88);
        slotArray = local_88;
        if (bVar2) {
          ScopeSlots::ScopeSlots(&local_90,local_88);
          sVar5 = ScopeSlots::GetCount(&local_90);
          local_88 = BoxScopeSlots(this,slotArray,(uint)sVar5);
        }
        FrameDisplay::SetItem((FrameDisplay *)pBStack_28,(uint)pScope._6_2_,local_88);
        FrameDisplay::SetItem(boxedFrameDisplay,(uint)pScope._6_2_,local_88);
      }
      this_local = pBStack_28;
    }
  }
  return (FrameDisplay *)this_local;
}

Assistant:

FrameDisplay * StackScriptFunction::BoxState::BoxFrameDisplay(FrameDisplay * frameDisplay)
    {
        Assert(frameDisplay != nullptr);
        if (frameDisplay == &Js::NullFrameDisplay)
        {
            return frameDisplay;
        }

        FrameDisplay * boxedFrameDisplay = nullptr;
        if (boxedValues.TryGetValue(frameDisplay, (void **)&boxedFrameDisplay))
        {
            return boxedFrameDisplay;
        }

        // Create new frame display when we allocate the frame display on the stack
        uint16 length = frameDisplay->GetLength();
        if (!ThreadContext::IsOnStack(frameDisplay))
        {
            boxedFrameDisplay = frameDisplay;
        }
        else
        {
            boxedFrameDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        }
        boxedValues.Add(frameDisplay, boxedFrameDisplay);

        for (uint16 i = 0; i < length; i++)
        {
            // TODO: Once we allocate the slots on the stack, we can only look those slots
            Field(Var) * pScope = (Field(Var) *)frameDisplay->GetItem(i);
            // We don't do stack slots if we exceed max encoded slot count
            if (ScopeSlots::Is(pScope))
            {
                pScope = BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
            }
            boxedFrameDisplay->SetItem(i, pScope);
            frameDisplay->SetItem(i, pScope);
        }
        return boxedFrameDisplay;
    }